

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EvaluationFunction.cpp
# Opt level: O0

void __thiscall imrt::EvaluationFunction::generate_Z(EvaluationFunction *this,Plan *p)

{
  int iVar1;
  bool bVar2;
  reference pvVar3;
  map<int,_imrt::Station_*,_std::less<int>,_std::allocator<std::pair<const_int,_imrt::Station_*>_>_>
  *this_00;
  reference ppVar4;
  Matrix *this_01;
  mapped_type *ppSVar5;
  reference this_02;
  reference pvVar6;
  Plan *in_RSI;
  long in_RDI;
  Station *this_03;
  Matrix *Dep;
  int b;
  int angle;
  pair<int,_int> bl;
  iterator __end3;
  iterator __begin3;
  list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *__range3;
  list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> beamlets;
  double dose;
  int k;
  int o_1;
  int o;
  list<imrt::Station_*,_std::allocator<imrt::Station_*>_> *stations;
  key_type *in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff20;
  int in_stack_ffffffffffffff24;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_ffffffffffffff28;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_ffffffffffffff30;
  list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *in_stack_ffffffffffffff58;
  list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *in_stack_ffffffffffffff60;
  int iStack_84;
  _Self local_80;
  _Self local_78;
  undefined1 *local_70;
  pair<int,_int> local_68;
  undefined1 local_60 [24];
  key_type *local_48;
  int local_40;
  int local_3c;
  undefined8 local_38;
  double *local_30;
  double *local_28;
  int local_1c;
  list<imrt::Station_*,_std::allocator<imrt::Station_*>_> *local_18;
  
  local_18 = Plan::get_stations_abi_cxx11_(in_RSI);
  for (local_1c = 0; local_1c < *(int *)(in_RDI + 0x48); local_1c = local_1c + 1) {
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  *)(in_RDI + 0x10),(long)local_1c);
    local_28 = (double *)
               std::vector<double,_std::allocator<double>_>::begin
                         ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff18);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  *)(in_RDI + 0x10),(long)local_1c);
    local_30 = (double *)
               std::vector<double,_std::allocator<double>_>::end
                         ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff18);
    local_38 = 0;
    std::
    fill<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double>
              (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
               (double *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
  }
  for (local_3c = 0; local_3c < *(int *)(in_RDI + 0x48); local_3c = local_3c + 1) {
    local_40 = 0;
    while( true ) {
      iVar1 = local_40;
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x50),(long)local_3c);
      if (*pvVar3 <= iVar1) break;
      local_48 = (key_type *)0x0;
      this_00 = (map<int,_imrt::Station_*,_std::less<int>,_std::allocator<std::pair<const_int,_imrt::Station_*>_>_>
                 *)(in_RDI + 0xe0);
      local_68 = std::make_pair<int&,int&>(&in_stack_ffffffffffffff18->first,(int *)0x1207c0);
      std::
      unordered_map<std::pair<int,_int>,_std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_imrt::pair_hash,_std::equal_to<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
      ::operator[]((unordered_map<std::pair<int,_int>,_std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_imrt::pair_hash,_std::equal_to<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
                    *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                   in_stack_ffffffffffffff18);
      std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::list
                (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
      local_70 = local_60;
      local_78._M_node =
           (_List_node_base *)
           std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::begin
                     ((list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                      in_stack_ffffffffffffff18);
      local_80._M_node =
           (_List_node_base *)
           std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::end
                     ((list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                      in_stack_ffffffffffffff18);
      while( true ) {
        bVar2 = std::operator!=(&local_78,&local_80);
        if (!bVar2) break;
        ppVar4 = std::_List_iterator<std::pair<int,_int>_>::operator*
                           ((_List_iterator<std::pair<int,_int>_> *)0x120837);
        iStack_84 = (*ppVar4).second;
        std::vector<imrt::Volume,_std::allocator<imrt::Volume>_>::operator[]
                  (*(vector<imrt::Volume,_std::allocator<imrt::Volume>_> **)(in_RDI + 0x40),
                   (long)local_3c);
        this_01 = Volume::getDepositionMatrix
                            ((Volume *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20)
                             ,(int)((ulong)in_stack_ffffffffffffff18 >> 0x20));
        this_03 = (Station *)maths::Matrix::operator()(this_01,local_40,iStack_84);
        ppSVar5 = std::
                  map<int,_imrt::Station_*,_std::less<int>,_std::allocator<std::pair<const_int,_imrt::Station_*>_>_>
                  ::at(this_00,&this_01->rows_);
        in_stack_ffffffffffffff24 = Station::getIntensity(this_03,(int)((ulong)ppSVar5 >> 0x20));
        local_48 = (key_type *)
                   ((double)this_03 * (double)in_stack_ffffffffffffff24 + (double)local_48);
        std::_List_iterator<std::pair<int,_int>_>::operator++(&local_78);
      }
      in_stack_ffffffffffffff18 = local_48;
      this_02 = std::
                vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                              *)(in_RDI + 0x10),(long)local_3c);
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](this_02,(long)local_40);
      *pvVar6 = (double)in_stack_ffffffffffffff18 + *pvVar6;
      std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~list
                ((list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)0x12097b);
      local_40 = local_40 + 1;
    }
  }
  return;
}

Assistant:

void EvaluationFunction::generate_Z(const Plan& p){
	const list<Station*>& stations=p.get_stations();

	for(int o=0; o<nb_organs; o++)
	 	 std::fill(Z[o].begin(), Z[o].end(), 0.0);

	//we update the dose distribution matrices Z with the dose delivered by the station
	for(int o=0; o<nb_organs; o++){
		 for(int k=0; k<nb_voxels[o]; k++){
		   double dose=0.0;
			 list<pair <int,int> > beamlets = voxel2beamlet_list[make_pair(o,k)];
			 for(auto bl:beamlets){
				 int angle=bl.first; int b=bl.second;
				 const Matrix&  Dep = volumes[o].getDepositionMatrix(angle);
				 dose += Dep(k,b)*p.angle2station.at(angle)->getIntensity(b);
			 }
		   Z[o][k] += dose;
		 }
	}
}